

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

void __thiscall QDockAreaLayoutInfo::setCurrentTabId(QDockAreaLayoutInfo *this,quintptr id)

{
  int iVar1;
  unsigned_long_long uVar2;
  int i;
  int index;
  QTabBar *this_00;
  long in_FS_OFFSET;
  QVariant local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->tabbed == true) && (this_00 = this->tabBar, this_00 != (QTabBar *)0x0)) {
    index = 0;
    while( true ) {
      iVar1 = QTabBar::count(this_00);
      if (iVar1 <= index) break;
      QTabBar::tabData(&local_50,this->tabBar,index);
      uVar2 = qvariant_cast<unsigned_long_long>(&local_50);
      ::QVariant::~QVariant(&local_50);
      if (uVar2 == id) {
        QTabBar::setCurrentIndex(this->tabBar,index);
        break;
      }
      index = index + 1;
      this_00 = this->tabBar;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockAreaLayoutInfo::setCurrentTabId(quintptr id)
{
    if (!tabbed || tabBar == nullptr)
        return;

    for (int i = 0; i < tabBar->count(); ++i) {
        if (qvariant_cast<quintptr>(tabBar->tabData(i)) == id) {
            tabBar->setCurrentIndex(i);
            return;
        }
    }
}